

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Project.cpp
# Opt level: O0

void __thiscall
Project2D::preparePressureSolving(Project2D *this,SparseMatrix<double,_0,_int> *A,VectorXd *b)

{
  ushort uVar1;
  VectorXd *this_00;
  uint64_t uVar2;
  uint64_t cols;
  Storage *this_01;
  uint64_t *puVar3;
  unsigned_short *puVar4;
  unsigned_long *puVar5;
  long row;
  Scalar *pSVar6;
  double *pdVar7;
  CellLabel *pCVar8;
  Scalar *pSVar9;
  unsigned_short i_00;
  unsigned_short j_00;
  ulong uVar10;
  Scalar extraout_XMM0_Qa;
  byte local_79;
  uint8_t nonSolidNeib;
  uint64_t neibID;
  uint64_t realID;
  uint64_t id;
  uint16_t k;
  uint16_t j;
  uint16_t i;
  uint64_t m;
  uint64_t xy;
  uint64_t n;
  double scale;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_30;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_20;
  VectorXd *b_local;
  SparseMatrix<double,_0,_int> *A_local;
  Project2D *this_local;
  
  local_20 = &b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  b_local = (VectorXd *)A;
  A_local = (SparseMatrix<double,_0,_int> *)this;
  uVar2 = StaggeredGrid<double,_unsigned_short>::activeCellsNb((this->super_Project)._grid);
  cols = StaggeredGrid<double,_unsigned_short>::activeCellsNb((this->super_Project)._grid);
  Eigen::SparseMatrix<double,_0,_int>::resize(A,uVar2,cols);
  this_01 = Eigen::SparseMatrix<double,_0,_int>::data((SparseMatrix<double,_0,_int> *)b_local);
  Eigen::internal::CompressedStorage<double,_int>::squeeze(this_01);
  this_00 = b_local;
  uVar2 = StaggeredGrid<double,_unsigned_short>::activeCellsNb((this->super_Project)._grid);
  scale._4_4_ = 5;
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::Constant
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_30,uVar2,
             (Scalar *)((long)&scale + 4));
  scale._0_4_ = 0;
  Eigen::SparseMatrix<double,0,int>::
  reserve<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
            ((SparseMatrix<double,0,int> *)this_00,&local_30,(value_type *)&scale);
  Field<double,_unsigned_short>::reset(&((this->super_Project)._grid)->_Adiag);
  Field<double,_unsigned_short>::reset(&((this->super_Project)._grid)->_Ax);
  Field<double,_unsigned_short>::reset(&((this->super_Project)._grid)->_Ay);
  Field<double,_unsigned_short>::reset(&((this->super_Project)._grid)->_Az);
  Field<double,_unsigned_short>::reset(&((this->super_Project)._grid)->_precon);
  xy = 0;
  do {
    puVar3 = Field<double,_unsigned_short>::maxIt(&((this->super_Project)._grid)->_surface);
    if (*puVar3 <= xy) {
      Eigen::SparseMatrix<double,_0,_int>::makeCompressed((SparseMatrix<double,_0,_int> *)b_local);
      return;
    }
    puVar4 = Field<double,_unsigned_short>::x(&((this->super_Project)._grid)->_surface);
    uVar1 = *puVar4;
    puVar4 = Field<double,_unsigned_short>::y(&((this->super_Project)._grid)->_surface);
    uVar10 = xy % (ulong)(long)(int)((uint)uVar1 * (uint)*puVar4);
    puVar4 = Field<double,_unsigned_short>::x(&((this->super_Project)._grid)->_surface);
    i_00 = (unsigned_short)(uVar10 % (ulong)*puVar4);
    puVar4 = Field<double,_unsigned_short>::x(&((this->super_Project)._grid)->_surface);
    j_00 = (unsigned_short)(uVar10 / *puVar4);
    puVar5 = Field<unsigned_long,_unsigned_short>::operator()
                       (&((this->super_Project)._grid)->_pressureID,i_00,j_00,0);
    if (*puVar5 != 0) {
      row = *puVar5 - 1;
      if (i_00 != 0) {
        puVar5 = Field<unsigned_long,_unsigned_short>::operator()
                           (&((this->super_Project)._grid)->_pressureID,i_00 - 1,j_00,0);
        if (*puVar5 != 0) {
          pSVar6 = Eigen::SparseMatrix<double,_0,_int>::coeffRef
                             ((SparseMatrix<double,_0,_int> *)b_local,row,*puVar5 - 1);
          *pSVar6 = -1.0;
          pdVar7 = Field<double,_unsigned_short>::operator()
                             (&((this->super_Project)._grid)->_Adiag,i_00,j_00,0);
          *pdVar7 = *pdVar7 + 1.0;
        }
      }
      puVar4 = Field<double,_unsigned_short>::x(&((this->super_Project)._grid)->_surface);
      if (i_00 + 1 < (uint)*puVar4) {
        puVar5 = Field<unsigned_long,_unsigned_short>::operator()
                           (&((this->super_Project)._grid)->_pressureID,i_00 + 1,j_00,0);
        if (*puVar5 == 0) goto LAB_00127b51;
        pSVar6 = Eigen::SparseMatrix<double,_0,_int>::coeffRef
                           ((SparseMatrix<double,_0,_int> *)b_local,row,*puVar5 - 1);
        *pSVar6 = -1.0;
        pdVar7 = Field<double,_unsigned_short>::operator()
                           (&((this->super_Project)._grid)->_Adiag,i_00,j_00,0);
        *pdVar7 = *pdVar7 + 1.0;
        pdVar7 = Field<double,_unsigned_short>::operator()
                           (&((this->super_Project)._grid)->_Ax,i_00,j_00,0);
        *pdVar7 = -1.0;
      }
      else {
LAB_00127b51:
        puVar4 = Field<double,_unsigned_short>::x(&((this->super_Project)._grid)->_surface);
        if ((i_00 + 1 < (uint)*puVar4) &&
           (pCVar8 = Field<double,_unsigned_short>::label
                               (&((this->super_Project)._grid)->_surface,i_00 + 1,j_00,0),
           (*pCVar8 & EMPTY) != 0)) {
          pdVar7 = Field<double,_unsigned_short>::operator()
                             (&((this->super_Project)._grid)->_Adiag,i_00,j_00,0);
          *pdVar7 = *pdVar7 + 1.0;
        }
      }
      if (j_00 != 0) {
        puVar5 = Field<unsigned_long,_unsigned_short>::operator()
                           (&((this->super_Project)._grid)->_pressureID,i_00,j_00 - 1,0);
        if (*puVar5 != 0) {
          pSVar6 = Eigen::SparseMatrix<double,_0,_int>::coeffRef
                             ((SparseMatrix<double,_0,_int> *)b_local,row,*puVar5 - 1);
          *pSVar6 = -1.0;
          pdVar7 = Field<double,_unsigned_short>::operator()
                             (&((this->super_Project)._grid)->_Adiag,i_00,j_00,0);
          *pdVar7 = *pdVar7 + 1.0;
        }
      }
      puVar4 = Field<double,_unsigned_short>::y(&((this->super_Project)._grid)->_surface);
      if (j_00 + 1 < (uint)*puVar4) {
        puVar5 = Field<unsigned_long,_unsigned_short>::operator()
                           (&((this->super_Project)._grid)->_pressureID,i_00,j_00 + 1,0);
        if (*puVar5 == 0) goto LAB_00127d67;
        pSVar6 = Eigen::SparseMatrix<double,_0,_int>::coeffRef
                           ((SparseMatrix<double,_0,_int> *)b_local,row,*puVar5 - 1);
        *pSVar6 = -1.0;
        pdVar7 = Field<double,_unsigned_short>::operator()
                           (&((this->super_Project)._grid)->_Adiag,i_00,j_00,0);
        *pdVar7 = *pdVar7 + 1.0;
        pdVar7 = Field<double,_unsigned_short>::operator()
                           (&((this->super_Project)._grid)->_Ay,i_00,j_00,0);
        *pdVar7 = -1.0;
      }
      else {
LAB_00127d67:
        puVar4 = Field<double,_unsigned_short>::y(&((this->super_Project)._grid)->_surface);
        if ((j_00 + 1 < (uint)*puVar4) &&
           (pCVar8 = Field<double,_unsigned_short>::label
                               (&((this->super_Project)._grid)->_surface,i_00,j_00 + 1,0),
           (*pCVar8 & EMPTY) != 0)) {
          pdVar7 = Field<double,_unsigned_short>::operator()
                             (&((this->super_Project)._grid)->_Adiag,i_00,j_00,0);
          *pdVar7 = *pdVar7 + 1.0;
        }
      }
      local_79 = 4;
      if (i_00 == 0) {
        local_79 = 3;
      }
      if (j_00 == 0) {
        local_79 = local_79 - 1;
      }
      puVar4 = Field<double,_unsigned_short>::x(&((this->super_Project)._grid)->_surface);
      if ((uint)i_00 == *puVar4 - 1) {
        local_79 = local_79 - 1;
      }
      puVar4 = Field<double,_unsigned_short>::y(&((this->super_Project)._grid)->_surface);
      if ((uint)j_00 == *puVar4 - 1) {
        local_79 = local_79 - 1;
      }
      pSVar6 = Eigen::SparseMatrix<double,_0,_int>::coeffRef
                         ((SparseMatrix<double,_0,_int> *)b_local,row,row);
      *pSVar6 = (double)local_79;
      div(this,(uint)i_00,(uint)j_00);
      pSVar9 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeffRef
                         (local_20,row);
      *pSVar9 = extraout_XMM0_Qa;
    }
    xy = xy + 1;
  } while( true );
}

Assistant:

void Project2D::preparePressureSolving(
        Eigen::SparseMatrix<double>& A,
        Eigen::VectorXd& b
    )
{
    A.resize(_grid.activeCellsNb(), _grid.activeCellsNb());
    A.data().squeeze();
    A.reserve(Eigen::VectorXi::Constant(_grid.activeCellsNb(), 5));
    _grid._Adiag.reset();
    _grid._Ax.reset();
    _grid._Ay.reset();
    _grid._Az.reset();
    _grid._precon.reset();

    const double scale = 1;
    for (std::uint64_t n = 0; n < _grid._surface.maxIt(); ++n)
    {
        const std::uint64_t xy =
            static_cast<std::uint64_t>(_grid._surface.x()*_grid._surface.y());
        const std::uint64_t m = n % xy;
        const std::uint16_t i = m % _grid._surface.x();
        const std::uint16_t j = m / _grid._surface.x();
        const std::uint16_t k = 0;

        std::uint64_t id = _grid._pressureID(i, j, k);
        if (id > 0)
        {
            const std::uint64_t realID = id-1;
            std::uint64_t neibID = 0;
            if (i > 0 && (neibID = _grid._pressureID(i-1, j, k)) > 0)
            {
                A.coeffRef(realID, neibID-1) = -scale;
                _grid._Adiag(i, j, k) += scale;
            }
            if (i+1 < _grid._surface.x() &&
                    (neibID = _grid._pressureID(i+1, j, k)) > 0)
            {
                A.coeffRef(realID, neibID-1) = -scale;
                _grid._Adiag(i, j, k) += scale;
                _grid._Ax(i, j, k) = -scale;
            }
            else if (i+1 < _grid._surface.x() &&
                    _grid._surface.label(i+1, j, k) & EMPTY)
            {
                _grid._Adiag(i, j, k) += scale;
            }
            if (j > 0 && (neibID = _grid._pressureID(i, j-1, k)) > 0)
            {
                A.coeffRef(realID, neibID-1) = -scale;
                _grid._Adiag(i, j, k) += scale;
            }
            if (j+1 < _grid._surface.y() &&
                    (neibID = _grid._pressureID(i, j+1, k)) > 0)
            {
                A.coeffRef(realID, neibID-1) = -scale;
                _grid._Adiag(i, j, k) += scale;
                _grid._Ay(i, j, k) = -scale;
            }
            else if (j+1 < _grid._surface.y() &&
                    _grid._surface.label(i, j+1, k) & EMPTY)
            {
                _grid._Adiag(i, j, k) += scale;
            }

            std::uint8_t nonSolidNeib = 4;
            if (i == 0)
                nonSolidNeib--;
            if (j == 0)
                nonSolidNeib--;
            if (i == _grid._surface.x()-1)
                nonSolidNeib--;
            if (j == _grid._surface.y()-1)
                nonSolidNeib--;
            A.coeffRef(realID, realID) = nonSolidNeib;
            b.coeffRef(realID) = div(i, j, k);
        }
    }
    A.makeCompressed();
}